

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O1

void sei_cat(sei_t *to,sei_t *from,int itu_t_t35)

{
  sei_msgtype_t sVar1;
  size_t __n;
  sei_message_t *psVar2;
  sei_message_t **ppsVar3;
  sei_message_t *psVar4;
  
  if ((from != (sei_t *)0x0 && to != (sei_t *)0x0) &&
     (psVar4 = from->head, psVar4 != (sei_message_t *)0x0)) {
    do {
      if ((itu_t_t35 != 0) || (psVar4->type != sei_type_user_data_registered_itu_t_t35)) {
        sVar1 = psVar4->type;
        __n = psVar4->size;
        psVar2 = (sei_message_t *)malloc(__n + 0x18);
        psVar2->next = (_sei_message_t *)0x0;
        psVar2->type = sVar1;
        psVar2->size = __n;
        memcpy(psVar2 + 1,psVar4 + 1,__n);
        ppsVar3 = &to->head;
        if (to->head != (sei_message_t *)0x0) {
          ppsVar3 = &to->tail->next;
        }
        *ppsVar3 = psVar2;
        to->tail = psVar2;
      }
      psVar4 = psVar4->next;
    } while (psVar4 != (_sei_message_t *)0x0);
  }
  return;
}

Assistant:

void sei_cat(sei_t* to, sei_t* from, int itu_t_t35)
{
    if (!to || !from) {
        return;
    }

    sei_message_t* msg = NULL;
    for (msg = sei_message_head(from); msg; msg = sei_message_next(msg)) {
        if (itu_t_t35 || sei_type_user_data_registered_itu_t_t35 != msg->type) {
            sei_message_append(to, sei_message_copy(msg));
        }
    }
}